

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

dma_memory ixy::memory_allocate_dma(size_t size,bool require_contiguous)

{
  dma_memory dVar1;
  __pid_t __val;
  int iVar2;
  value_type *pvVar3;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_198;
  undefined1 local_181;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_180;
  void *local_170;
  void *virt_addr;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_160;
  undefined1 local_149;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_148;
  int local_134;
  undefined1 local_130 [4];
  int fd;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  path path;
  uint32_t id;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_48;
  undefined1 local_39;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_38;
  byte local_21;
  size_t sStack_20;
  bool require_contiguous_local;
  size_t size_local;
  uintptr_t local_10;
  
  local_21 = require_contiguous;
  sStack_20 = size;
  memset(&local_39,0,1);
  local_38.list.second = (char *)operator<<("allocating dma memory via huge page");
  debug<ixy::Pair<ixy::None,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp",
             0xc,"memory_allocate_dma",&local_38);
  if ((sStack_20 & 0x1fffff) != 0) {
    sStack_20 = ((sStack_20 >> 0x15) + 1) * 0x200000;
  }
  if (((local_21 & 1) != 0) && (0x200000 < sStack_20)) {
    memset(&path.field_0x27,0,1);
    local_48 = operator<<("could not map physically contiguous memory");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x15,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&id);
  }
  LOCK();
  UNLOCK();
  path._32_4_ = huge_pg_id;
  huge_pg_id = huge_pg_id + 1;
  __val = getpid();
  std::__cxx11::to_string(&local_100,__val);
  std::operator+(&local_e0,"/mnt/huge/ixy-",&local_100);
  std::operator+(&local_c0,&local_e0,"-");
  std::__cxx11::to_string((string *)local_130,path._32_4_);
  std::operator+(&local_a0,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
  std::filesystem::__cxx11::path::path((path *)local_80,&local_a0,auto_format);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_80);
  local_134 = open(pvVar3,0x42,0x1c0);
  if (local_134 == -1) {
    local_149 = 0;
    local_148.list.second =
         (char *)operator<<("failed to open hugetlbfs file, check that /mnt/huge is mounted");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x1e,"memory_allocate_dma",&local_148);
  }
  iVar2 = ftruncate(local_134,sStack_20);
  if (iVar2 == -1) {
    virt_addr._7_1_ = 0;
    local_160.list.second =
         (char *)operator<<("failed to allocate huge page memory, check hugetlbfs configuration");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x22,"memory_allocate_dma",&local_160);
  }
  local_170 = mmap((void *)0x0,sStack_20,3,0x40001,local_134,0);
  if (local_170 == (void *)0xffffffffffffffff) {
    local_181 = 0;
    local_180.list.second = (char *)operator<<("failed to mmap huge page");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x28,"memory_allocate_dma",&local_180);
  }
  iVar2 = mlock(local_170,sStack_20);
  if (iVar2 == -1) {
    local_198.list.second = (char *)operator<<("disable swap for DMA memory");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x2d,"memory_allocate_dma",&local_198);
  }
  close(local_134);
  pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_80);
  unlink(pvVar3);
  size_local = (size_t)local_170;
  local_10 = virt_to_phys(local_170);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  dVar1.phy = local_10;
  dVar1.virt = (void *)size_local;
  return dVar1;
}

Assistant:

auto memory_allocate_dma(size_t size, bool require_contiguous) -> dma_memory {
    debug("allocating dma memory via huge page");
    // round up to multiples of 2 MB if necessary, this is the wasteful part
    // this could be fixed by co-locating allocations on the same page until a request would be too large
    // when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
    if (size % HUGE_PAGE_SIZE) {
        size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
    }
    if (require_contiguous && size > HUGE_PAGE_SIZE) {
        // this is the place to implement larger contiguous physical mappings if that's ever needed
        error("could not map physically contiguous memory");
    }
    // unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
    uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);

    fs::path path{"/mnt/huge/ixy-" + std::to_string(getpid()) + "-" + std::to_string(id)};
    int fd = open(path.c_str(), O_CREAT | O_RDWR, S_IRWXU);

    if (fd == -1) {
        error("failed to open hugetlbfs file, check that /mnt/huge is mounted");
    }

    if (ftruncate(fd, static_cast<off_t>(size)) == -1) {
        error("failed to allocate huge page memory, check hugetlbfs configuration");
    }

    void *virt_addr = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0);

    if (virt_addr == MAP_FAILED) {
        error("failed to mmap huge page");
    }

    // never swap out DMA memory
    if (mlock(virt_addr, size) == -1) {
        error("disable swap for DMA memory");
    }

    // don't keep it around in the hugetlbfs
    close(fd);
    unlink(path.c_str());

    return (dma_memory{virt_addr, virt_to_phys(virt_addr)});
}